

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void DoTransform(uint32_t bits,int16_t *src,uint8_t *dst)

{
  uint uVar1;
  uint8_t *in_RDX;
  int16_t *in_RSI;
  uint in_EDI;
  
  uVar1 = in_EDI >> 0x1e;
  if (uVar1 == 1) {
    (*VP8TransformDC)(in_RSI,in_RDX);
  }
  else if (uVar1 == 2) {
    (*VP8TransformAC3)(in_RSI,in_RDX);
  }
  else if (uVar1 == 3) {
    (*VP8Transform)(in_RSI,in_RDX,0);
  }
  return;
}

Assistant:

static WEBP_INLINE void DoTransform(uint32_t bits, const int16_t* const src,
                                    uint8_t* const dst) {
  switch (bits >> 30) {
    case 3:
      VP8Transform(src, dst, 0);
      break;
    case 2:
      VP8TransformAC3(src, dst);
      break;
    case 1:
      VP8TransformDC(src, dst);
      break;
    default:
      break;
  }
}